

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ll_ifc_symphony.c
# Opt level: O0

int32_t ll_dl_band_cfg_set(llabs_dl_band_cfg_t *p)

{
  _Bool _Var1;
  int32_t local_20;
  int32_t ret;
  llabs_dl_band_cfg_t *p_local;
  
  if (p == (llabs_dl_band_cfg_t *)0x0) {
    p_local._4_4_ = -0x65;
  }
  else {
    _Var1 = transport_mutex_grab();
    if (_Var1) {
      ll_dl_band_cfg_serialize(p,_ll_ifc_message_buff);
      local_20 = hal_read_write(OP_DL_BAND_CFG_SET,_ll_ifc_message_buff,0xe,(uint8_t *)0x0,0);
      transport_mutex_release();
      if (-1 < local_20) {
        local_20 = 0;
      }
      p_local._4_4_ = local_20;
    }
    else {
      p_local._4_4_ = -0x71;
    }
  }
  return p_local._4_4_;
}

Assistant:

int32_t ll_dl_band_cfg_set(const llabs_dl_band_cfg_t *p)
{
    if (p == NULL)
    {
        return LL_IFC_ERROR_INCORRECT_PARAMETER;
    }

    if (!(transport_mutex_grab()))
    {
        return LL_IFC_ERROR_HAL_CALL_FAILED;
    }

    ll_dl_band_cfg_serialize(p, &_ll_ifc_message_buff[0]);

    int32_t ret = hal_read_write(OP_DL_BAND_CFG_SET, &_ll_ifc_message_buff[0], DL_BAND_CFG_SIZE, NULL, 0);

    transport_mutex_release();

    return (ret >= 0) ? LL_IFC_ACK : ret;
}